

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto_writer.h
# Opt level: O1

void __thiscall
google::protobuf::util::converter::ProtoWriter::ProtoElement::~ProtoElement(ProtoElement *this)

{
  BaseElement *pBVar1;
  
  (this->super_BaseElement)._vptr_BaseElement = (_func_int **)&PTR__ProtoElement_003c8f30;
  (this->super_LocationTrackerInterface)._vptr_LocationTrackerInterface =
       (_func_int **)&PTR__ProtoElement_003c8f60;
  std::_Bvector_base<std::allocator<bool>_>::_M_deallocate
            (&(this->oneof_indices_).super__Bvector_base<std::allocator<bool>_>);
  std::
  _Rb_tree<const_google::protobuf::Field_*,_const_google::protobuf::Field_*,_std::_Identity<const_google::protobuf::Field_*>,_std::less<const_google::protobuf::Field_*>,_std::allocator<const_google::protobuf::Field_*>_>
  ::~_Rb_tree(&(this->required_fields_)._M_t);
  (this->super_BaseElement)._vptr_BaseElement = (_func_int **)&PTR__BaseElement_003c8e30;
  pBVar1 = (this->super_BaseElement).parent_._M_t.
           super___uniq_ptr_impl<google::protobuf::util::converter::StructuredObjectWriter::BaseElement,_std::default_delete<google::protobuf::util::converter::StructuredObjectWriter::BaseElement>_>
           ._M_t.
           super__Tuple_impl<0UL,_google::protobuf::util::converter::StructuredObjectWriter::BaseElement_*,_std::default_delete<google::protobuf::util::converter::StructuredObjectWriter::BaseElement>_>
           .
           super__Head_base<0UL,_google::protobuf::util::converter::StructuredObjectWriter::BaseElement_*,_false>
           ._M_head_impl;
  if (pBVar1 != (BaseElement *)0x0) {
    (*pBVar1->_vptr_BaseElement[1])();
  }
  (this->super_BaseElement).parent_._M_t.
  super___uniq_ptr_impl<google::protobuf::util::converter::StructuredObjectWriter::BaseElement,_std::default_delete<google::protobuf::util::converter::StructuredObjectWriter::BaseElement>_>
  ._M_t.
  super__Tuple_impl<0UL,_google::protobuf::util::converter::StructuredObjectWriter::BaseElement_*,_std::default_delete<google::protobuf::util::converter::StructuredObjectWriter::BaseElement>_>
  .
  super__Head_base<0UL,_google::protobuf::util::converter::StructuredObjectWriter::BaseElement_*,_false>
  ._M_head_impl = (BaseElement *)0x0;
  return;
}

Assistant:

~ProtoElement() override {}